

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableI2cAnalyzer.cpp
# Opt level: O2

void __thiscall EnrichableI2cAnalyzer::SetupResults(EnrichableI2cAnalyzer *this)

{
  EnrichableI2cAnalyzerResults *this_00;
  
  this_00 = (EnrichableI2cAnalyzerResults *)operator_new(0x28);
  EnrichableI2cAnalyzerResults::EnrichableI2cAnalyzerResults
            (this_00,this,(this->mSettings)._M_ptr,(this->mSubprocess)._M_ptr);
  std::auto_ptr<EnrichableI2cAnalyzerResults>::reset(&this->mResults,this_00);
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)(this->mResults)._M_ptr);
  return;
}

Assistant:

void EnrichableI2cAnalyzer::SetupResults()
{
	mResults.reset( new EnrichableI2cAnalyzerResults( this, mSettings.get(), mSubprocess.get() ) );
	SetAnalyzerResults( mResults.get() );
	mResults->AddChannelBubblesWillAppearOn( mSettings->mSdaChannel );
}